

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

PaddingLayerParams_PaddingConstant * __thiscall
CoreML::Specification::PaddingLayerParams::mutable_constant(PaddingLayerParams *this)

{
  bool bVar1;
  PaddingLayerParams_PaddingConstant *this_00;
  PaddingLayerParams *this_local;
  
  bVar1 = has_constant(this);
  if (!bVar1) {
    clear_PaddingType(this);
    set_has_constant(this);
    this_00 = (PaddingLayerParams_PaddingConstant *)operator_new(0x18);
    PaddingLayerParams_PaddingConstant::PaddingLayerParams_PaddingConstant(this_00);
    (this->PaddingType_).constant_ = this_00;
  }
  return (this->PaddingType_).constant_;
}

Assistant:

inline ::CoreML::Specification::PaddingLayerParams_PaddingConstant* PaddingLayerParams::mutable_constant() {
  if (!has_constant()) {
    clear_PaddingType();
    set_has_constant();
    PaddingType_.constant_ = new ::CoreML::Specification::PaddingLayerParams_PaddingConstant;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.PaddingLayerParams.constant)
  return PaddingType_.constant_;
}